

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_with_internal_transitions.cpp
# Opt level: O2

void __thiscall afsm::test::FSM_MachineWithInstate_Test::TestBody(FSM_MachineWithInstate_Test *this)

{
  char *pcVar1;
  char *in_R9;
  bool bVar2;
  AssertHelper local_198;
  AssertHelper local_190;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  test_sm tsm;
  
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&tsm);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[5]>
            (&tsm.super_observer_wrapper<afsm::test::test_fsm_observer>,(char (*) [5])0x475570);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = tsm.
          super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          .super_type.
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
          .
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
          .transitions_.current_state_ == 1;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x42,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       tsm.
       super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
       .super_type.
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
       .
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
       .transitions_.current_state_ != 0;
  if (tsm.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x43,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_198.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::in_state>(&tsm,(in_state *)&local_190);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&gtest_ar_,
             (event_process_result *)&local_198);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x46,pcVar1);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = tsm.
          super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          .super_type.
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
          .
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
          .transitions_.current_state_ == 1;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x48,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       tsm.
       super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
       .super_type.
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
       .
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
       .transitions_.current_state_ != 0;
  if (tsm.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x49,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_198.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::a_to_b>(&tsm,(a_to_b *)&local_190);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"actions::event_process_result::process",
             "tsm.process_event(events::a_to_b{})",(event_process_result *)&gtest_ar_,
             (event_process_result *)&local_198);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x4d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = tsm.
          super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          .super_type.
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
          .
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
          .transitions_.current_state_ == 0;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x4f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       tsm.
       super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
       .super_type.
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
       .
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
       .transitions_.current_state_ != 1;
  if (tsm.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x50,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_198.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::in_state>(&tsm,(in_state *)&local_190);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&gtest_ar_,
             (event_process_result *)&local_198);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x53,pcVar1);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = tsm.
          super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          .super_type.
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
          .
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
          .transitions_.current_state_ == 0;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x55,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       tsm.
       super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
       .super_type.
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
       .
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
       .transitions_.current_state_ != 1;
  if (tsm.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x56,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_198.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::b_to_a>(&tsm,(b_to_a *)&local_190);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"actions::event_process_result::process",
             "tsm.process_event(events::b_to_a{})",(event_process_result *)&gtest_ar_,
             (event_process_result *)&local_198);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  bVar2 = tsm.
          super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          .super_type.
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
          .
          super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
          .transitions_.current_state_ == 1;
  gtest_ar_.success_ = bVar2;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x5c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       tsm.
       super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
       .super_type.
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
       .
       super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
       .transitions_.current_state_ != 0;
  if (tsm.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x5d,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_198);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_198.data_._0_4_ =
       state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
       ::process_event<afsm::test::events::in_state>(&tsm,(in_state *)&local_190);
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&gtest_ar,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&gtest_ar_,
             (event_process_result *)&local_198);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x60,pcVar1);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::~state_machine(&tsm);
  return;
}

Assistant:

TEST(FSM, MachineWithInstate)
{
    test_sm tsm;
    tsm.make_observer("test");
    // *** INITIAL STATE ***
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // *** A -> B ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::a_to_b{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // *** B -> A ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::b_to_a{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
}